

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall
kratos::VarConcat::VarConcat
          (VarConcat *this,shared_ptr<kratos::Var> *first,shared_ptr<kratos::Var> *second)

{
  int iVar1;
  int iVar2;
  VarException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  element_type *local_c8;
  element_type *local_c0;
  string local_b8;
  pointer local_98;
  pointer ppIStack_90;
  pointer local_78;
  undefined8 uStack_70;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_58;
  undefined8 uStack_40;
  allocator_type local_31;
  
  Expr::Expr(&this->super_Expr,
             (first->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             (second->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  (this->super_Expr).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002d5d68;
  (this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(first->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(second->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((element_type *)
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start)->is_signed_ ==
      ((element_type *)
      local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish)->is_signed_) {
    std::vector<kratos::Var*,std::allocator<kratos::Var*>>::_M_assign_aux<kratos::Var*const*>
              ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&this->vars_,&local_58);
    iVar1 = (*(((first->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_IRNode)._vptr_IRNode[7])();
    iVar2 = (*(((second->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_IRNode)._vptr_IRNode[7])();
    (this->super_Expr).super_Var.var_width_ = iVar2 + iVar1;
    (this->super_Expr).op = Concat;
    return;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  (*(((first->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
    _vptr_IRNode[0x1f])(&local_98);
  (*(((second->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
    _vptr_IRNode[0x1f])(&local_78);
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = local_98;
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppIStack_90;
  local_58.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
  uStack_40 = uStack_70;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x1c;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_58;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_b8,(detail *)"{0} is signed but {1} is not",format_str,args);
  local_c8 = (first->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_c0 = (second->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_c8;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_58,__l,&local_31);
  VarException::VarException(this_00,&local_b8,&local_58);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

VarConcat::VarConcat(const std::shared_ptr<Var> &first, const std::shared_ptr<Var> &second)
    : Expr(first.get(), second.get()) {
    if (first->is_signed() != second->is_signed())
        throw VarException(
            ::format("{0} is signed but {1} is not", first->to_string(), second->to_string()),
            {first.get(), second.get()});
    vars_ = {first.get(), second.get()};
    var_width_ = first->width() + second->width();
    op = ExprOp::Concat;
}